

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall soul::heart::Printer::PrinterStream::printAll(PrinterStream *this)

{
  size_t sVar1;
  pool_ref<soul::heart::Variable> *ppVar2;
  value_type *__x;
  pool_ref<soul::heart::Function> *ppVar3;
  Module *pMVar4;
  ModuleType MVar5;
  long lVar6;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  Indent indent;
  string local_48;
  
  pMVar4 = this->module;
  sVar1 = (pMVar4->stateVariables).stateVariables.numActive;
  if (sVar1 != 0) {
    ppVar2 = (pMVar4->stateVariables).stateVariables.items;
    lVar6 = 0;
    do {
      __x = *(value_type **)(*(long *)((long)&ppVar2->object + lVar6) + 0x30);
      if (__x == (value_type *)0x0) {
        throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->allVisibleVariables,__x);
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
    pMVar4 = this->module;
  }
  MVar5 = pMVar4->moduleType;
  if (MVar5 == processorModule) {
    text._M_str = "processor ";
    text._M_len = 10;
    choc::text::CodePrinter::writeBlock(this->out,text);
    pMVar4 = this->module;
    MVar5 = pMVar4->moduleType;
  }
  if (MVar5 == graphModule) {
    text_00._M_str = "graph ";
    text_00._M_len = 6;
    choc::text::CodePrinter::writeBlock(this->out,text_00);
    pMVar4 = this->module;
    MVar5 = pMVar4->moduleType;
  }
  if (MVar5 == namespaceModule) {
    text_01._M_str = "namespace ";
    text_01._M_len = 10;
    choc::text::CodePrinter::writeBlock(this->out,text_01);
    pMVar4 = this->module;
  }
  text_02._M_str = (pMVar4->fullName)._M_dataplus._M_p;
  text_02._M_len = (pMVar4->fullName)._M_string_length;
  choc::text::CodePrinter::writeBlock(this->out,text_02);
  printDescription(this,&this->module->annotation);
  local_48.field_2._M_allocated_capacity._0_2_ = 10;
  local_48._M_string_length = 1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  choc::text::CodePrinter::append(this->out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT62(local_48.field_2._M_allocated_capacity._2_6_,
                             local_48.field_2._M_allocated_capacity._0_2_) + 1);
  }
  choc::text::CodePrinter::Indent::Indent((Indent *)&local_48,this->out,2,'{','}');
  if (this->module->moduleType != namespaceModule) {
    printInputs(this);
    printOutputs(this);
    choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  }
  printNodes(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printConnections(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printLatency(this);
  printStateVariables(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printStructs(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  sVar1 = (this->module->functions).functions.numActive;
  if (sVar1 != 0) {
    ppVar3 = (this->module->functions).functions.items;
    lVar6 = 0;
    do {
      printFunction(this,*(Function **)((long)&ppVar3->object + lVar6));
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  choc::text::CodePrinter::Indent::~Indent((Indent *)&local_48);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  return;
}

Assistant:

void printAll()
        {
            for (auto& v : module.stateVariables.get())
                allVisibleVariables.push_back (v->name);

            if (module.isProcessor())   out << "processor ";
            if (module.isGraph())       out << "graph ";
            if (module.isNamespace())   out << "namespace ";

            out << module.fullName;
            printDescription (module.annotation);
            out << newLine;

            {
                auto indent = out.createIndentWithBraces (2);

                if (! module.isNamespace())
                {
                    printInputs();
                    printOutputs();
                    out << blankLine;
                }

                printNodes();
                out << blankLine;
                printConnections();
                out << blankLine;
                printLatency();
                printStateVariables();
                out << blankLine;
                printStructs();
                out << blankLine;
                printFunctions();
            }

            out << blankLine;
        }